

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O3

void Saig_ManFoldConstrTest(Aig_Man_t *pAig)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Aig_Man_t *pAig_00;
  Vec_Int_t *vConstrs;
  int *__ptr;
  Aig_Man_t *pMan;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  long lVar8;
  
  pAig_00 = Saig_ManDupUnfoldConstrs(pAig);
  uVar1 = pAig_00->nTruePos;
  vConstrs = (Vec_Int_t *)malloc(0x10);
  uVar5 = uVar1 - 1;
  uVar3 = 0x10;
  if (0xe < uVar5) {
    uVar3 = uVar1;
  }
  vConstrs->nCap = uVar3;
  if (uVar3 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar3 << 2);
  }
  vConstrs->pArray = __ptr;
  vConstrs->nSize = uVar1;
  auVar2 = _DAT_0094e250;
  if ((int)uVar1 < 1) {
    if (uVar1 != 0) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    pMan = Saig_ManDupFoldConstrs(pAig_00,vConstrs);
    if (__ptr != (int *)0x0) {
LAB_006e1926:
      free(__ptr);
    }
    free(vConstrs);
    Ioa_WriteAiger(pMan,"test.aig",0,0);
    Aig_ManStop(pAig_00);
    Aig_ManStop(pMan);
    return;
  }
  lVar8 = (ulong)uVar1 - 1;
  auVar6._8_4_ = (int)lVar8;
  auVar6._0_8_ = lVar8;
  auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
  uVar4 = 0;
  auVar6 = auVar6 ^ _DAT_0094e250;
  auVar7 = _DAT_0094e240;
  do {
    auVar9 = auVar7 ^ auVar2;
    if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                auVar6._4_4_ < auVar9._4_4_) & 1)) {
      __ptr[uVar4] = (int)uVar4;
    }
    if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
        auVar9._12_4_ <= auVar6._12_4_) {
      __ptr[uVar4 + 1] = (int)uVar4 + 1;
    }
    uVar4 = uVar4 + 2;
    lVar8 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar8 + 2;
  } while ((uVar1 + 1 & 0xfffffffe) != uVar4);
  uVar4 = 0;
LAB_006e18d0:
  if (__ptr[uVar4] != 0) goto code_r0x006e18d7;
  if ((int)uVar4 + 1 < (int)uVar1) {
    do {
      __ptr[uVar4] = __ptr[uVar4 + 1];
      uVar4 = uVar4 + 1;
    } while ((long)(int)uVar5 != uVar4);
  }
  vConstrs->nSize = uVar5;
LAB_006e1918:
  pMan = Saig_ManDupFoldConstrs(pAig_00,vConstrs);
  goto LAB_006e1926;
code_r0x006e18d7:
  uVar4 = uVar4 + 1;
  if (uVar1 == uVar4) goto LAB_006e1918;
  goto LAB_006e18d0;
}

Assistant:

void Saig_ManFoldConstrTest( Aig_Man_t * pAig )
{
    Aig_Man_t * pAig1, * pAig2;
    Vec_Int_t * vConstrs;
    // unfold constraints
    pAig1 = Saig_ManDupUnfoldConstrs( pAig );
    // create the constraint list
    vConstrs = Vec_IntStartNatural( Saig_ManPoNum(pAig1) );
    Vec_IntRemove( vConstrs, 0 );
    // fold constraints back
    pAig2 = Saig_ManDupFoldConstrs( pAig1, vConstrs );
    Vec_IntFree( vConstrs );
    // compare the two AIGs
    Ioa_WriteAiger( pAig2, "test.aig", 0, 0 );
    Aig_ManStop( pAig1 );
    Aig_ManStop( pAig2 );
}